

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O1

RefAST __thiscall antlr::ASTFactory::create(ASTFactory *this,RefAST *tr)

{
  long *plVar1;
  int iVar2;
  _func_int **pp_Var3;
  long *in_RDX;
  _func_int *p_Var4;
  ASTRefCount<antlr::AST> local_20;
  
  pp_Var3 = nullAST;
  plVar1 = (long *)*in_RDX;
  if ((plVar1 == (long *)0x0) || (*plVar1 == 0)) {
    if (nullAST == (_func_int **)0x0) {
      pp_Var3 = (_func_int **)0x0;
    }
    else {
      *(int *)(nullAST + 1) = *(int *)(nullAST + 1) + 1;
    }
    this->_vptr_ASTFactory = pp_Var3;
  }
  else {
    iVar2 = (**(code **)(*(long *)*plVar1 + 0x80))();
    (*(code *)(&(tr[3].ref)->ptr)[iVar2]->ref)();
    if (this->_vptr_ASTFactory == (_func_int **)0x0) {
      p_Var4 = (_func_int *)0x0;
    }
    else {
      p_Var4 = *this->_vptr_ASTFactory;
    }
    local_20.ref = (ASTRef *)*in_RDX;
    if (local_20.ref == (ASTRef *)0x0) {
      local_20.ref = (ASTRef *)0x0;
    }
    else {
      (local_20.ref)->count = (local_20.ref)->count + 1;
    }
    (**(code **)(*(long *)p_Var4 + 0x90))();
    ASTRefCount<antlr::AST>::~ASTRefCount(&local_20);
  }
  return (RefAST)(ASTRef *)this;
}

Assistant:

RefAST ASTFactory::create(RefAST tr)
{
	if (!tr)
		return nullAST;

//	cout << "create(tr)" << endl;

	RefAST t = nodeFactories[tr->getType()]->second();
	t->initialize(tr);
	return t;
}